

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Quaternion QuaternionLerp(Quaternion q1,Quaternion q2,float amount)

{
  Quaternion QVar1;
  undefined4 uStack_38;
  float amount_local;
  Quaternion q2_local;
  Quaternion q1_local;
  Quaternion result;
  
  q2_local.z = q1.x;
  uStack_38 = q2.x;
  q2_local.w = q1.y;
  amount_local = q2.y;
  q1_local.x = q1.z;
  q2_local.x = q2.z;
  q1_local.y = q1.w;
  q2_local.y = q2.w;
  QVar1.y = amount * (amount_local - q2_local.w) + q2_local.w;
  QVar1.x = amount * (uStack_38 - q2_local.z) + q2_local.z;
  QVar1.z = amount * (q2_local.x - q1_local.x) + q1_local.x;
  QVar1.w = amount * (q2_local.y - q1_local.y) + q1_local.y;
  return QVar1;
}

Assistant:

RMDEF Quaternion QuaternionLerp(Quaternion q1, Quaternion q2, float amount)
{
    Quaternion result = { 0 };

    result.x = q1.x + amount*(q2.x - q1.x);
    result.y = q1.y + amount*(q2.y - q1.y);
    result.z = q1.z + amount*(q2.z - q1.z);
    result.w = q1.w + amount*(q2.w - q1.w);

    return result;
}